

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void renameWalkTrigger(Walker *pWalker,Trigger *pTrigger)

{
  Upsert *pUVar1;
  SrcList *pSVar2;
  byte *pbVar3;
  long lVar4;
  TriggerStep *pTVar5;
  Upsert *pUpsert;
  
  if (pTrigger->pWhen != (Expr *)0x0) {
    sqlite3WalkExprNN(pWalker,pTrigger->pWhen);
  }
  for (pTVar5 = pTrigger->step_list; pTVar5 != (TriggerStep *)0x0; pTVar5 = pTVar5->pNext) {
    sqlite3WalkSelect(pWalker,pTVar5->pSelect);
    if (pTVar5->pWhere != (Expr *)0x0) {
      sqlite3WalkExprNN(pWalker,pTVar5->pWhere);
    }
    sqlite3WalkExprList(pWalker,pTVar5->pExprList);
    pUVar1 = pTVar5->pUpsert;
    if (pUVar1 != (Upsert *)0x0) {
      sqlite3WalkExprList(pWalker,pUVar1->pUpsertTarget);
      sqlite3WalkExprList(pWalker,pUVar1->pUpsertSet);
      if (pUVar1->pUpsertWhere != (Expr *)0x0) {
        sqlite3WalkExprNN(pWalker,pUVar1->pUpsertWhere);
      }
      if (pUVar1->pUpsertTargetWhere != (Expr *)0x0) {
        sqlite3WalkExprNN(pWalker,pUVar1->pUpsertTargetWhere);
      }
    }
    pSVar2 = pTVar5->pFrom;
    if ((pSVar2 != (SrcList *)0x0) && (0 < pSVar2->nSrc)) {
      pbVar3 = &pSVar2->a[0].fg.field_0x1;
      lVar4 = 0;
      do {
        if ((*pbVar3 & 4) != 0) {
          sqlite3WalkSelect(pWalker,(Select *)**(undefined8 **)(pbVar3 + 0x27));
        }
        lVar4 = lVar4 + 1;
        pbVar3 = pbVar3 + 0x48;
      } while (lVar4 < pSVar2->nSrc);
    }
  }
  return;
}

Assistant:

static void renameWalkTrigger(Walker *pWalker, Trigger *pTrigger){
  TriggerStep *pStep;

  /* Find tokens to edit in WHEN clause */
  sqlite3WalkExpr(pWalker, pTrigger->pWhen);

  /* Find tokens to edit in trigger steps */
  for(pStep=pTrigger->step_list; pStep; pStep=pStep->pNext){
    sqlite3WalkSelect(pWalker, pStep->pSelect);
    sqlite3WalkExpr(pWalker, pStep->pWhere);
    sqlite3WalkExprList(pWalker, pStep->pExprList);
    if( pStep->pUpsert ){
      Upsert *pUpsert = pStep->pUpsert;
      sqlite3WalkExprList(pWalker, pUpsert->pUpsertTarget);
      sqlite3WalkExprList(pWalker, pUpsert->pUpsertSet);
      sqlite3WalkExpr(pWalker, pUpsert->pUpsertWhere);
      sqlite3WalkExpr(pWalker, pUpsert->pUpsertTargetWhere);
    }
    if( pStep->pFrom ){
      int i;
      SrcList *pFrom = pStep->pFrom;
      for(i=0; i<pFrom->nSrc; i++){
        if( pFrom->a[i].fg.isSubquery ){
          assert( pFrom->a[i].u4.pSubq!=0 );
          sqlite3WalkSelect(pWalker, pFrom->a[i].u4.pSubq->pSelect);
        }
      }
    }
  }
}